

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O2

int Dau_DsdToGiaCompose_rec(Gia_Man_t *pGia,word Func,int *pFanins,int nVars)

{
  uint __line;
  int iVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  char *__assertion;
  ulong uVar5;
  
  if (Func == 0xffffffffffffffff) {
    iVar1 = 1;
  }
  else {
    if (Func != 0) {
      uVar3 = (ulong)(uint)nVars + 1;
      iVar1 = nVars + -1;
      do {
        iVar2 = iVar1;
        if (iVar2 + 1 < 1) {
          __assertion = "nVars > 0";
          __line = 0x3d;
LAB_003f5195:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,__line,"int Dau_DsdToGiaCompose_rec(Gia_Man_t *, word, int *, int)");
        }
        if (iVar2 == 0) {
          if ((Func == 0xaaaaaaaaaaaaaaaa) || (Func == 0x5555555555555555)) {
            iVar1 = Abc_LitNotCond(*pFanins,(uint)(Func == 0x5555555555555555));
            return iVar1;
          }
          __assertion = "Func == s_Truths6[0] || Func == s_Truths6Neg[0]";
          __line = 0x40;
          goto LAB_003f5195;
        }
        bVar4 = (byte)(1 << ((byte)iVar2 & 0x1f));
        uVar5 = uVar3 - 2 & 0xffffffff;
        uVar3 = uVar3 - 1;
        iVar1 = iVar2 + -1;
        if ((s_Truths6Neg[uVar5] & (Func >> (bVar4 & 0x3f) ^ Func)) != 0) {
          if (6 < uVar3) {
            __assert_fail("iVar >= 0 && iVar < 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                          ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
          }
          uVar3 = s_Truths6Neg[uVar5] & Func;
          iVar1 = Dau_DsdToGiaCompose_rec(pGia,uVar3 << (bVar4 & 0x3f) | uVar3,pFanins,iVar2);
          iVar2 = Dau_DsdToGiaCompose_rec
                            (pGia,(Func & s_Truths6[uVar5]) >> (bVar4 & 0x3f) |
                                  Func & s_Truths6[uVar5],pFanins,iVar2);
          if (pGia->pMuxes != (uint *)0x0) {
            iVar1 = Gia_ManHashMuxReal(pGia,pFanins[uVar5],iVar2,iVar1);
            return iVar1;
          }
          iVar1 = Gia_ManHashMux(pGia,pFanins[uVar5],iVar2,iVar1);
          return iVar1;
        }
      } while( true );
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Dau_DsdToGiaCompose_rec( Gia_Man_t * pGia, word Func, int * pFanins, int nVars )
{
    int t0, t1;
    if ( Func == 0 )
        return 0;
    if ( Func == ~(word)0 )
        return 1;
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        return Abc_LitNotCond( pFanins[0], (int)(Func == s_Truths6Neg[0]) );
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
        return Dau_DsdToGiaCompose_rec( pGia, Func, pFanins, nVars );
    t0 = Dau_DsdToGiaCompose_rec( pGia, Abc_Tt6Cofactor0(Func, nVars), pFanins, nVars );
    t1 = Dau_DsdToGiaCompose_rec( pGia, Abc_Tt6Cofactor1(Func, nVars), pFanins, nVars );
    if ( pGia->pMuxes )
        return Gia_ManHashMuxReal( pGia, pFanins[nVars], t1, t0 );
    else
        return Gia_ManHashMux( pGia, pFanins[nVars], t1, t0 );
}